

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_status(int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  int iVar1;
  sqlite3_int64 iHwtr;
  sqlite3_int64 iCur;
  sqlite3_int64 local_20;
  sqlite3_int64 local_18;
  
  local_18 = 0;
  local_20 = 0;
  iVar1 = sqlite3_status64(op,&local_18,&local_20,resetFlag);
  if (iVar1 == 0) {
    *pCurrent = (int)local_18;
    *pHighwater = (int)local_20;
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_status(int op, int *pCurrent, int *pHighwater, int resetFlag){
  sqlite3_int64 iCur = 0, iHwtr = 0;
  int rc;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCurrent==0 || pHighwater==0 ) return SQLITE_MISUSE_BKPT;
#endif
  rc = sqlite3_status64(op, &iCur, &iHwtr, resetFlag);
  if( rc==0 ){
    *pCurrent = (int)iCur;
    *pHighwater = (int)iHwtr;
  }
  return rc;
}